

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleWriteCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool append)

{
  string *in_name;
  pointer pbVar1;
  _Ios_Openmode _Var2;
  bool bVar3;
  bool bVar4;
  mode_t mode;
  string error_1;
  string fileName;
  string message;
  string dir;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_248 [2];
  ofstream file;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  in_name = pbVar1 + 1;
  std::__cxx11::string::string((string *)&fileName,(string *)in_name);
  bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (!bVar4) {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,"/",
                   in_name);
    std::__cxx11::string::append((string *)&fileName);
    std::__cxx11::string::~string((string *)&file);
  }
  bVar4 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&fileName);
  if (bVar4) {
    cmsys::SystemTools::GetFilenamePath(&dir,&fileName);
    cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
    mode = 0;
    bVar4 = cmsys::SystemTools::GetPermissions(&fileName,&mode);
    if (bVar4) {
      bVar3 = true;
      if (-1 < (char)mode) {
        bVar3 = false;
        cmsys::SystemTools::SetPermissions(&fileName,mode | 0x90,false);
      }
    }
    else {
      bVar3 = false;
    }
    _Var2 = _S_out;
    if (append) {
      _Var2 = _S_app;
    }
    std::ofstream::ofstream(&file,fileName._M_dataplus._M_p,_Var2);
    if (((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      local_248[0].Begin._M_current = pbVar1 + 2;
      local_248[0].End._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      error_1._M_dataplus._M_p = (pointer)&error_1.field_2;
      error_1._M_string_length = 0;
      error_1.field_2._M_local_buf[0] = '\0';
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&message,local_248,error_1._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&error_1);
      std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&message);
      bVar4 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar4) {
        std::ofstream::close();
        if (!bVar3 && mode != 0) {
          cmsys::SystemTools::SetPermissions(&fileName,mode,false);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error_1,"write failed (",(allocator<char> *)local_248);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::__cxx11::string::append((string *)&error_1);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::append((char *)&error_1);
        std::__cxx11::string::append((string *)&error_1);
        cmCommand::SetError(&this->super_cmCommand,&error_1);
        std::__cxx11::string::~string((string *)&error_1);
      }
      std::__cxx11::string::~string((string *)&message);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message,"failed to open for writing (",(allocator<char> *)&error_1);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::append((string *)&message);
      std::__cxx11::string::~string((string *)&error_1);
      std::__cxx11::string::append((char *)&message);
      std::__cxx11::string::append((string *)&message);
      cmCommand::SetError(&this->super_cmCommand,&message);
      std::__cxx11::string::~string((string *)&message);
      bVar4 = false;
    }
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    std::operator+(&dir,"attempted to write a file: ",&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir,
                   " into a source directory.");
    std::__cxx11::string::~string((string *)&dir);
    cmCommand::SetError(&this->super_cmCommand,(string *)&file);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::string::~string((string *)&file);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&fileName);
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
                                       bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
  }

  i++;

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error = "write failed (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}